

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounding_box.cc
# Opt level: O0

void __thiscall draco::BoundingBox::BoundingBox(BoundingBox *this)

{
  Vector3f *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float in_stack_ffffffffffffffd4;
  float local_20;
  float local_1c;
  float local_18;
  VectorD<float,_3> local_14;
  
  local_18 = std::numeric_limits<float>::max();
  local_1c = std::numeric_limits<float>::max();
  local_20 = std::numeric_limits<float>::max();
  VectorD<float,_3>::VectorD(&local_14,&local_18,&local_1c,&local_20);
  fVar1 = std::numeric_limits<float>::lowest();
  fVar2 = std::numeric_limits<float>::lowest();
  fVar3 = std::numeric_limits<float>::lowest();
  VectorD<float,_3>::VectorD
            ((VectorD<float,_3> *)&stack0xffffffffffffffd4,(Scalar *)&stack0xffffffffffffffd0,
             (Scalar *)&stack0xffffffffffffffcc,(Scalar *)&stack0xffffffffffffffc8);
  BoundingBox((BoundingBox *)CONCAT44(in_stack_ffffffffffffffd4,fVar1),
              (Vector3f *)CONCAT44(fVar2,fVar3),in_RDI);
  return;
}

Assistant:

BoundingBox::BoundingBox()
    : BoundingBox(Vector3f(std::numeric_limits<float>::max(),
                           std::numeric_limits<float>::max(),
                           std::numeric_limits<float>::max()),
                  Vector3f(std::numeric_limits<float>::lowest(),
                           std::numeric_limits<float>::lowest(),
                           std::numeric_limits<float>::lowest())) {}